

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onFatalException
          (MockExceptionCallback *this,Exception *exception)

{
  string *psVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *__haystack;
  char *ptrCopy;
  char *local_48;
  long local_40;
  
  psVar1 = &this->text;
  ::std::__cxx11::string::append((char *)psVar1);
  kj::operator*(&local_48,exception);
  __haystack = "";
  if (local_40 != 0) {
    __haystack = local_48;
  }
  pcVar2 = strstr(__haystack,"\nstack: ");
  if (pcVar2 == (char *)0x0) {
    ::std::__cxx11::string::append((char *)psVar1);
  }
  else {
    ::std::__cxx11::string::replace
              ((ulong)psVar1,(this->text)._M_string_length,(char *)0x0,(ulong)__haystack);
  }
  ::std::__cxx11::string::push_back((char)psVar1);
  flush(this);
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&(anonymous_namespace)::MockException::typeinfo,0);
}

Assistant:

void onFatalException(Exception&& exception) override {
    text += "fatal exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
#if KJ_NO_EXCEPTIONS
    if (outputPipe >= 0) {
      // This is a child process.  We got what we want, now exit quickly without writing any
      // additional messages, with a status code that the parent will interpret as "exited in the
      // way we expected".
      _exit(74);
    }
#else
    throw MockException();
#endif
  }